

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLNodeLinOp::resizeMultiGrid(MLNodeLinOp *this,int new_size)

{
  int *piVar1;
  Long LVar2;
  FabArrayBase *pFVar3;
  int in_ESI;
  long in_RDI;
  Geometry *in_stack_00000018;
  DistributionMapping *in_stack_00000020;
  BoxArray *in_stack_00000028;
  iMultiFab *omask;
  Geometry *geom;
  int mglev;
  int amrlev;
  GpuArray<amrex::LinOpBCType,_3U> hibc;
  GpuArray<amrex::LinOpBCType,_3U> lobc;
  MultiFab *in_stack_fffffffffffffd58;
  MultiFab *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  int icomp;
  MLLinOp *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd78;
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *in_stack_fffffffffffffd80;
  int *in_stack_fffffffffffffd88;
  MakeType *in_stack_fffffffffffffd90;
  MFInfo *info;
  BoxArray *in_stack_fffffffffffffd98;
  DistributionMapping *in_stack_fffffffffffffda0;
  BoxArray *in_stack_fffffffffffffda8;
  undefined4 uVar4;
  int iVar5;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffdc0;
  _func_int **local_230;
  MFInfo local_228;
  undefined1 local_200 [292];
  CoarseningStrategy in_stack_ffffffffffffff24;
  pointer in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  Geometry *in_stack_ffffffffffffff38;
  iMultiFab *in_stack_ffffffffffffff40;
  MultiFab *in_stack_ffffffffffffff48;
  
  icomp = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  if ((0 < in_ESI) &&
     (iVar5 = in_ESI,
     piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60,
                         (size_type)in_stack_fffffffffffffd58), iVar5 < *piVar1)) {
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
    LVar2 = Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            ::size((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)0x1925c37);
    if (in_ESI < LVar2) {
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
      std::
      vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::resize(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
    if ((*(byte *)(in_RDI + 0x565) & 1) != 0) {
      uVar4 = 0;
      MLLinOp::LoBC(in_stack_fffffffffffffd70,icomp);
      MLLinOp::HiBC(in_stack_fffffffffffffd70,icomp);
      if (in_ESI == 1) {
        in_stack_fffffffffffffda8 =
             (BoxArray *)
             std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                       ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                        in_stack_fffffffffffffd60);
        pFVar3 = (FabArrayBase *)
                 std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::
                 operator->((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                            0x1925d5a);
        FabArrayBase::nComp(pFVar3);
        std::make_unique<amrex::iMultiFab,amrex::iMultiFab&,amrex::MakeType,int,int>
                  ((iMultiFab *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
        std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
                  ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   in_stack_fffffffffffffd60,
                   (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   in_stack_fffffffffffffd58);
        std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
                  ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   in_stack_fffffffffffffd70);
      }
      else {
        Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
        in_stack_fffffffffffffd98 =
             Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
        Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
        in_stack_fffffffffffffda0 =
             Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
             operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
        Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
        Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
        makeOwnerMask(in_stack_00000028,in_stack_00000020,in_stack_00000018);
        std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
                  ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   in_stack_fffffffffffffd60,
                   (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   in_stack_fffffffffffffd58);
        std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
                  ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   in_stack_fffffffffffffd70);
      }
      Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    *)in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
      Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                 in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
      pFVar3 = (FabArrayBase *)
               std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                         ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                          in_stack_fffffffffffffd60);
      icomp = (int)((ulong)local_200 >> 0x20);
      MultiFab::MultiFab(in_stack_fffffffffffffd60);
      MultiFab::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      MultiFab::~MultiFab((MultiFab *)0x1925ef8);
      FabArrayBase::boxArray(pFVar3);
      FabArrayBase::DistributionMap(pFVar3);
      local_228.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.alloc = false;
      local_228._1_7_ = 0;
      local_228.arena = (Arena *)0x0;
      local_228.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      info = &local_228;
      MFInfo::MFInfo((MFInfo *)0x1925f4d);
      local_230 = (_func_int **)0x0;
      in_stack_fffffffffffffd70 = (MLLinOp *)&local_230;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffd60);
      MultiFab::define((MultiFab *)CONCAT44(iVar5,uVar4),in_stack_fffffffffffffda8,
                       in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                       (int)in_stack_fffffffffffffd98,info,in_stack_fffffffffffffdc0);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x1925f9d);
      MFInfo::~MFInfo((MFInfo *)0x1925faa);
      anon_unknown_1::MLNodeLinOp_set_dot_mask
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (GpuArray<amrex::LinOpBCType,_3U> *)in_stack_ffffffffffffff30,
                 (GpuArray<amrex::LinOpBCType,_3U> *)in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff24);
    }
    MLLinOp::resizeMultiGrid(in_stack_fffffffffffffd70,icomp);
  }
  return;
}

Assistant:

void
MLNodeLinOp::resizeMultiGrid (int new_size)
{
    if (new_size <= 0 || new_size >= m_num_mg_levels[0]) { return; }

    if (m_dirichlet_mask[0].size() > new_size) {
        m_dirichlet_mask[0].resize(new_size);
    }

    if (m_masks_built)
    {
        const auto lobc = LoBC();
        const auto hibc = HiBC();
        int amrlev = 0;
        int mglev = new_size-1;
        if (mglev == 0) {
            m_owner_mask_bottom = std::make_unique<iMultiFab>(*m_owner_mask_top, amrex::make_alias, 0,
                                                              m_owner_mask_top->nComp());
        } else {
            m_owner_mask_bottom = makeOwnerMask(m_grids[0][mglev],
                                                 m_dmap[0][mglev],
                                                 m_geom[0][mglev]);
        }
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_bottom;
        m_bottom_dot_mask = MultiFab();
        m_bottom_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_bottom_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }

    MLLinOp::resizeMultiGrid(new_size);
}